

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.h
# Opt level: O2

void __thiscall FsmTable::~FsmTable(FsmTable *this)

{
  pointer ppFVar1;
  FsmState *this_00;
  FsmState **pfstate;
  pointer ppFVar2;
  
  ppFVar1 = (this->m_vpfstate).super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar2 = (this->m_vpfstate).super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar1; ppFVar2 = ppFVar2 + 1
      ) {
    this_00 = *ppFVar2;
    if (this_00 != (FsmState *)0x0) {
      FsmState::~FsmState(this_00);
    }
    operator_delete(this_00,0x90);
  }
  std::_Vector_base<FsmState_*,_std::allocator<FsmState_*>_>::~_Vector_base
            (&(this->m_vpfstate).super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>);
  return;
}

Assistant:

~FsmTable()
	{
		for (auto && pfstate: m_vpfstate)
			delete pfstate;
	}